

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O3

void toggle(vmd_bst_t *tree,vmd_bst_rev_t *rev,vmd_bst_node_t **affected)

{
  undefined1 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 uVar6;
  int iVar7;
  size_t sVar8;
  void *pvVar9;
  int iVar10;
  vmd_bst_node_t *pvVar11;
  size_t sVar12;
  vmd_bst_node_t *pvVar13;
  long lVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  if (0 < rev->erased_count) {
    lVar14 = 0;
    do {
      pvVar13 = rev->erased[lVar14];
      pvVar11 = pvVar13->child[0];
      if (pvVar11 == pvVar13) {
        tree->free = (vmd_bst_node_t *)0x0;
      }
      else {
        if (tree->free == pvVar13) {
          tree->free = pvVar11;
          pvVar11 = pvVar13->child[0];
        }
        pvVar13->child[1]->child[0] = pvVar11;
        pvVar13->child[0]->child[1] = pvVar13->child[1];
      }
      memcpy(&rev->erased[lVar14]->field_0x21,
             (void *)(tree->csize * lVar14 + (long)rev->erased_data),tree->csize);
      lVar14 = lVar14 + 1;
    } while (lVar14 < rev->erased_count);
    if (0 < rev->erased_count) {
      lVar14 = 0;
      do {
        pvVar13 = rev->erased[lVar14];
        if ((pvVar13->field_0x20 & 0x20) == 0) {
          pvVar13->field_0x20 = pvVar13->field_0x20 & 0x5f;
          puVar1 = &rev->erased[lVar14]->field_0x20;
          *puVar1 = *puVar1 | 0x20;
          pvVar13 = rev->erased[lVar14];
          pvVar13->next = *affected;
          *affected = pvVar13;
          pvVar13 = rev->erased[lVar14];
        }
        insert_node(tree,pvVar13);
        lVar14 = lVar14 + 1;
      } while (lVar14 < rev->erased_count);
    }
  }
  iVar10 = rev->inserted_count;
  if (0 < iVar10) {
    lVar14 = 0;
    do {
      pvVar13 = rev->inserted[lVar14];
      if ((pvVar13->field_0x20 & 0x20) == 0) {
        pvVar13->field_0x20 = pvVar13->field_0x20 | 0x80;
        puVar1 = &rev->inserted[lVar14]->field_0x20;
        *puVar1 = *puVar1 | 0x20;
        pvVar13 = rev->inserted[lVar14];
        pvVar13->next = *affected;
        *affected = pvVar13;
        pvVar13 = rev->inserted[lVar14];
      }
      erase_node(tree,pvVar13);
      lVar14 = lVar14 + 1;
      iVar10 = rev->inserted_count;
    } while (lVar14 < iVar10);
  }
  if (0 < rev->changed_count) {
    lVar14 = 0;
    do {
      erase_node(tree,rev->changed[lVar14]);
      pvVar13 = rev->changed[lVar14];
      sVar8 = tree->csize;
      if (sVar8 != 0) {
        pvVar9 = rev->changed_data;
        sVar12 = 0;
        do {
          uVar6 = *(undefined1 *)((long)pvVar13->child + sVar12 + 0x19);
          *(undefined1 *)((long)pvVar13->child + sVar12 + 0x19) =
               *(undefined1 *)((long)pvVar9 + sVar12 + sVar8 * lVar14);
          *(undefined1 *)((long)pvVar9 + sVar12 + sVar8 * lVar14) = uVar6;
          sVar12 = sVar12 + 1;
        } while (sVar8 != sVar12);
        pvVar13 = rev->changed[lVar14];
      }
      insert_node(tree,pvVar13);
      lVar14 = lVar14 + 1;
    } while (lVar14 < rev->changed_count);
    iVar10 = rev->inserted_count;
  }
  iVar7 = rev->erased_count;
  rev->erased_count = iVar10;
  rev->inserted_count = iVar7;
  uVar2 = rev->inserted;
  uVar4 = rev->erased;
  auVar15._8_4_ = (int)uVar2;
  auVar15._0_8_ = uVar4;
  auVar15._12_4_ = (int)((ulong)uVar2 >> 0x20);
  rev->inserted = (vmd_bst_node_t **)uVar4;
  rev->erased = (vmd_bst_node_t **)auVar15._8_8_;
  uVar3 = rev->uninserted_data;
  uVar5 = rev->erased_data;
  auVar16._8_4_ = (int)uVar3;
  auVar16._0_8_ = uVar5;
  auVar16._12_4_ = (int)((ulong)uVar3 >> 0x20);
  rev->uninserted_data = (void *)uVar5;
  rev->erased_data = (void *)auVar16._8_8_;
  free_erased(tree,rev);
  return;
}

Assistant:

static void
toggle(bst_t *tree, bst_rev_t *rev, bst_node_t **affected)
{
	unfree_erased(tree, rev);

#ifndef DOXYGEN_IGNORE
#define ADD(node, was) \
	if (!node->inserted) { \
		node->was_in_tree = was; \
		node->inserted = 1; \
		slist_push(affected, node); \
	}
#endif
	int i;
	for (i = 0; i < rev->erased_count; i++) {
		ADD(rev->erased[i], 0);
		insert_node(tree, rev->erased[i]);
	}
	for (i = 0; i < rev->inserted_count; i++) {
		ADD(rev->inserted[i], 1);
		erase_node(tree, rev->inserted[i]);
	}
#undef ADD
	for (i = 0; i < rev->changed_count; i++) {
		//TODO: optimize
		erase_node(tree, rev->changed[i]);
		memswap(rev->changed[i]->data, rev->changed_data + i * tree->csize, tree->csize);
		insert_node(tree, rev->changed[i]);
	}

	SWAP(rev->erased_count, rev->inserted_count, int);
	SWAP(rev->erased, rev->inserted, void *);
	SWAP(rev->erased_data, rev->uninserted_data, void *);

	free_erased(tree, rev);
}